

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<cbtFace>::cbtAlignedObjectArray
          (cbtAlignedObjectArray<cbtFace> *this,cbtAlignedObjectArray<cbtFace> *otherArray)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint newsize;
  cbtFace *pcVar3;
  cbtFace *pcVar4;
  undefined8 uVar5;
  long lVar6;
  cbtFace cStack_58;
  
  this->m_ownsMemory = true;
  this->m_data = (cbtFace *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  newsize = otherArray->m_size;
  cStack_58.m_plane[0] = 0.0;
  cStack_58.m_plane[1] = 0.0;
  cStack_58.m_plane[2] = 0.0;
  cStack_58.m_plane[3] = 0.0;
  cStack_58.m_indices._0_4_ = 0;
  cStack_58.m_indices._12_4_ = 0;
  cStack_58.m_indices.m_ownsMemory = true;
  cStack_58.m_indices._25_7_ = 0;
  cStack_58.m_indices.m_data = (int *)0x0;
  cStack_58.m_indices.m_size = 0;
  cStack_58.m_indices.m_capacity = 0;
  resize(this,newsize,&cStack_58);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&cStack_58.m_indices);
  if (0 < (int)newsize) {
    pcVar3 = this->m_data;
    lVar6 = 0;
    do {
      pcVar4 = otherArray->m_data;
      cbtAlignedObjectArray<int>::cbtAlignedObjectArray
                ((cbtAlignedObjectArray<int> *)((long)pcVar3->m_plane + lVar6 + -0x20),
                 (cbtAlignedObjectArray<int> *)((long)pcVar4->m_plane + lVar6 + -0x20));
      puVar1 = (undefined8 *)((long)pcVar4->m_plane + lVar6);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)pcVar3->m_plane + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar6 = lVar6 + 0x30;
    } while ((ulong)newsize * 0x30 != lVar6);
  }
  return;
}

Assistant:

cbtAlignedObjectArray(const cbtAlignedObjectArray& otherArray)
	{
		init();

		int otherSize = otherArray.size();
		resize(otherSize);
		otherArray.copy(0, otherSize, m_data);
	}